

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t __thiscall c4::yml::Tree::_claim(Tree *this)

{
  size_t *psVar1;
  NodeData *pNVar2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  bool bVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  size_t cap;
  ulong uVar12;
  char msg [36];
  char local_f8 [28];
  undefined4 uStack_dc;
  undefined8 local_d8;
  char acStack_d0 [24];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  char *pcStack_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  char *pcStack_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  char *pcStack_28;
  undefined8 local_20;
  
  if ((this->m_free_head == 0xffffffffffffffff) || (this->m_buf == (NodeData *)0x0)) {
    sVar9 = this->m_cap * 2;
    cap = 0x10;
    if (sVar9 != 0) {
      cap = sVar9;
    }
    reserve(this,cap);
    if (this->m_free_head == 0xffffffffffffffff) {
      builtin_strncpy(local_f8,"check failed: (m_free_head !",0x1c);
      uStack_dc = 0x4f4e203d;
      local_d8._0_4_ = 0x29454e;
      if (((byte)s_error_flags & 1) != 0) {
        bVar8 = is_debugger_attached();
        if (bVar8) {
          pcVar3 = (code *)swi(3);
          sVar9 = (*pcVar3)();
          return sVar9;
        }
      }
      local_40 = 0;
      uStack_38 = 0x63aa;
      local_30 = 0;
      pcStack_28 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_20 = 0x65;
      LVar4.super_LineCol.col = 0;
      LVar4.super_LineCol.offset = SUB168(ZEXT816(0x63aa) << 0x40,0);
      LVar4.super_LineCol.line = SUB168(ZEXT816(0x63aa) << 0x40,8);
      LVar4.name.str._0_4_ = 0x24bb3d;
      LVar4.name.str._4_4_ = 0;
      LVar4.name.len = 0x65;
      (*(this->m_callbacks).m_error)(local_f8,0x24,LVar4,(this->m_callbacks).m_user_data);
    }
  }
  uVar10 = this->m_cap;
  if (uVar10 <= this->m_size) {
    builtin_strncpy(local_f8,"check failed: (m_size < m_ca",0x1c);
    uStack_dc = CONCAT13(uStack_dc._3_1_,0x2970);
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar3 = (code *)swi(3);
        sVar9 = (*pcVar3)();
        return sVar9;
      }
    }
    local_68 = 0;
    uStack_60 = 0x63ad;
    local_58 = 0;
    pcStack_50 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_48 = 0x65;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x63ad) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x63ad) << 0x40,8);
    LVar5.name.str._0_4_ = 0x24bb3d;
    LVar5.name.str._4_4_ = 0;
    LVar5.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_f8,0x1f,LVar5,(this->m_callbacks).m_user_data);
    uVar10 = this->m_cap;
  }
  uVar12 = this->m_free_head;
  if (uVar10 <= uVar12) {
    local_d8._0_1_ = '&';
    local_d8._1_1_ = '&';
    local_d8._2_1_ = ' ';
    local_d8._3_1_ = 'm';
    local_d8._4_1_ = '_';
    local_d8._5_1_ = 'f';
    local_d8._6_1_ = 'r';
    local_d8._7_1_ = 'e';
    builtin_strncpy(acStack_d0,"e_head < m_cap)",0x10);
    builtin_strncpy(local_f8,"check failed: (m_free_head >",0x1c);
    uStack_dc = 0x2030203d;
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar3 = (code *)swi(3);
        sVar9 = (*pcVar3)();
        return sVar9;
      }
    }
    local_90 = 0;
    uStack_88 = 0x63ae;
    local_80 = 0;
    pcStack_78 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_70 = 0x65;
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x63ae) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x63ae) << 0x40,8);
    LVar6.name.str._0_4_ = 0x24bb3d;
    LVar6.name.str._4_4_ = 0;
    LVar6.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_f8,0x38,LVar6,(this->m_callbacks).m_user_data);
    uVar10 = this->m_cap;
    uVar12 = this->m_free_head;
  }
  uVar11 = this->m_size + 1;
  this->m_size = uVar11;
  sVar9 = this->m_buf[uVar12].m_next_sibling;
  this->m_free_head = sVar9;
  if ((sVar9 == 0xffffffffffffffff) && (this->m_free_tail = 0xffffffffffffffff, uVar11 != uVar10)) {
    builtin_strncpy(local_f8,"check failed: (m_size == m_c",0x1c);
    uStack_dc = 0x297061;
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar3 = (code *)swi(3);
        sVar9 = (*pcVar3)();
        return sVar9;
      }
    }
    local_b8 = 0;
    uStack_b0 = 0x63b8;
    local_a8 = 0;
    pcStack_a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_98 = 0x65;
    LVar7.super_LineCol.col = 0;
    LVar7.super_LineCol.offset = SUB168(ZEXT816(0x63b8) << 0x40,0);
    LVar7.super_LineCol.line = SUB168(ZEXT816(0x63b8) << 0x40,8);
    LVar7.name.str._0_4_ = 0x24bb3d;
    LVar7.name.str._4_4_ = 0;
    LVar7.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_f8,0x20,LVar7,(this->m_callbacks).m_user_data);
    uVar10 = this->m_cap;
  }
  if ((uVar12 == 0xffffffffffffffff) || (uVar10 <= uVar12)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar3 = (code *)swi(3);
        sVar9 = (*pcVar3)();
        return sVar9;
      }
    }
    local_f8[0] = '\0';
    local_f8[1] = '\0';
    local_f8[2] = '\0';
    local_f8[3] = '\0';
    local_f8[4] = '\0';
    local_f8[5] = '\0';
    local_f8[6] = '\0';
    local_f8[7] = '\0';
    local_f8[8] = -0x7d;
    local_f8[9] = 'K';
    local_f8[10] = '\0';
    local_f8[0xb] = '\0';
    local_f8[0xc] = '\0';
    local_f8[0xd] = '\0';
    local_f8[0xe] = '\0';
    local_f8[0xf] = 0;
    local_f8[0x10] = '\0';
    local_f8[0x11] = '\0';
    local_f8[0x12] = '\0';
    local_f8[0x13] = '\0';
    local_f8[0x14] = '\0';
    local_f8[0x15] = '\0';
    local_f8[0x16] = '\0';
    local_f8[0x17] = '\0';
    local_f8[0x18] = '=';
    local_f8[0x19] = -0x45;
    local_f8[0x1a] = '$';
    local_f8[0x1b] = '\0';
    uStack_dc = 0;
    local_d8 = 0x65;
    (*(code *)PTR_error_impl_0029d7a8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar2 = this->m_buf;
  *(undefined1 (*) [16])&pNVar2[uVar12].m_val.scalar.len = (undefined1  [16])0x0;
  *(undefined1 (*) [16])&pNVar2[uVar12].m_val.tag.len = (undefined1  [16])0x0;
  *(undefined1 (*) [16])&pNVar2[uVar12].m_key.anchor.len = (undefined1  [16])0x0;
  *(undefined1 (*) [16])&pNVar2[uVar12].m_key.scalar.len = (undefined1  [16])0x0;
  *(undefined1 (*) [16])&pNVar2[uVar12].m_key.tag.len = (undefined1  [16])0x0;
  pNVar2[uVar12].m_type = NOTYPE;
  pNVar2[uVar12].m_key.tag.str = (char *)0x0;
  pNVar2[uVar12].m_val.anchor.len = 0;
  psVar1 = &pNVar2[uVar12].m_parent;
  *(undefined4 *)psVar1 = 0xffffffff;
  *(undefined4 *)((long)psVar1 + 4) = 0xffffffff;
  *(undefined4 *)(psVar1 + 1) = 0xffffffff;
  *(undefined4 *)((long)psVar1 + 0xc) = 0xffffffff;
  pNVar2[uVar12].m_last_child = 0xffffffffffffffff;
  return uVar12;
}

Assistant:

size_t Tree::_claim()
{
    if(m_free_head == NONE || m_buf == nullptr)
    {
        size_t sz = 2 * m_cap;
        sz = sz ? sz : 16;
        reserve(sz);
        _RYML_CB_ASSERT(m_callbacks, m_free_head != NONE);
    }

    _RYML_CB_ASSERT(m_callbacks, m_size < m_cap);
    _RYML_CB_ASSERT(m_callbacks, m_free_head >= 0 && m_free_head < m_cap);

    size_t ichild = m_free_head;
    NodeData *child = m_buf + ichild;

    ++m_size;
    m_free_head = child->m_next_sibling;
    if(m_free_head == NONE)
    {
        m_free_tail = NONE;
        _RYML_CB_ASSERT(m_callbacks, m_size == m_cap);
    }

    _clear(ichild);

    return ichild;
}